

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChMatrix33<double>::Get_A_Eulero
          (ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *this)

{
  undefined1 auVar1 [16];
  double __x;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double local_28;
  
  __x = acos((this->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
  ;
  __return_storage_ptr__->m_data[1] = __x;
  dVar3 = (this->super_Matrix<double,_3,_3,_1,_3,_3>).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar2 = sin(__x);
  dVar3 = acos(dVar3 / dVar2);
  __return_storage_ptr__->m_data[2] = dVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  auVar1 = vxorpd_avx512vl(auVar4,auVar1);
  dVar3 = sin(__x);
  local_28 = auVar1._0_8_;
  dVar3 = acos(local_28 / dVar3);
  __return_storage_ptr__->m_data[0] = dVar3;
  if ((__x == 0.0) && (!NAN(__x))) {
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChMatrix33<Real>::Get_A_Eulero() const {
    ChVector<Real> eul;

    eul.y() = std::acos((*this)(2, 2));                       // rho, nutation
    eul.z() = std::acos((*this)(2, 1) / std::sin(eul.y()));   // csi, spin
    eul.x() = std::acos(-(*this)(1, 2) / std::sin(eul.y()));  // rho, nutation

    if (eul.y() == 0) {  // handle undefined initial position set
        eul.x() = 0;
        eul.z() = 0;
    }

    return eul;
}